

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void jmp_dropval(FuncState *fs,BCPos list)

{
  uint uVar1;
  BCInsLine *pBVar2;
  uint uVar3;
  long lVar4;
  
  if (list != 0xffffffff) {
    do {
      pBVar2 = fs->bcbase;
      uVar3 = list - 1;
      if (list == 0) {
        uVar3 = 0;
      }
      uVar1 = pBVar2[uVar3].ins;
      if ((uVar1 & 0xfe) == 0xc) {
        *(byte *)&pBVar2[uVar3].ins = (byte)uVar1 | 2;
        *(undefined1 *)((long)&pBVar2[uVar3].ins + 1) = 0;
      }
      else if ((~uVar1 & 0xff00) == 0) {
        pBVar2[uVar3].ins = (uint)*(byte *)((long)&pBVar2[list].ins + 1) << 8 | 0x80000058;
      }
      lVar4 = (ulong)*(ushort *)((long)&fs->bcbase[list].ins + 2) - 0x8000;
      list = list + 1 + (int)lVar4;
      if (lVar4 == -1) {
        list = 0xffffffff;
      }
    } while (list != 0xffffffff);
  }
  return;
}

Assistant:

static void jmp_dropval(FuncState *fs, BCPos list)
{
  for (; list != NO_JMP; list = jmp_next(fs, list))
    jmp_patchtestreg(fs, list, NO_REG);
}